

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

bool __thiscall
ExecutorRegVm::ExecCall
          (ExecutorRegVm *this,uint microcodePos,uint functionId,RegVmCmd *instruction,
          RegVmRegister *regFilePtr)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ExternFuncInfo *pEVar5;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *regFilePtr_00;
  uint uVar6;
  RegVmReturnType RVar7;
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar8;
  FastVector<char,_true,_true> *this_00;
  char *pcVar9;
  uint *puVar10;
  uint *puVar11;
  uint newSize;
  uint uVar12;
  ulong uVar13;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar14;
  RegVmCmd *local_58;
  RegVmReturnType local_4c;
  FastVector<char,_true,_true> *local_48;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *local_40;
  ulong local_38;
  
  if (this->exFunctions->count <= functionId) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,
                  "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                 );
  }
  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
  pEVar5 = this->exFunctions->data;
  puVar10 = (this->exLinker->exRegVmConstants).data + microcodePos;
  uVar6 = *puVar10;
  do {
    if (uVar6 == 1) {
      uVar13 = (ulong)(byte)puVar10[1];
      puVar11 = puVar10 + 3;
      uVar6 = pEVar5[functionId].regVmAddress;
      local_58 = instruction + 1;
      RVar7 = (RegVmReturnType)(byte)puVar10[2];
      if ((ulong)uVar6 == 0xffffffff) {
        uVar6 = (this->callStack).count;
        if (uVar6 == (this->callStack).max) {
          FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar6,&local_58);
        }
        else {
          (this->callStack).count = uVar6 + 1;
          (this->callStack).data[uVar6] = local_58;
        }
        paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                  ((long)paVar14 - (ulong)(pEVar5[functionId].argumentSize & 0xfffffffc));
        if (paVar14 != (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase) {
          __assert_fail("tempStackPtr == tempStackArrayBase",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0x571,
                        "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                       );
        }
        if (pEVar5[functionId].funcPtrWrap != (_func_void_void_ptr_char_ptr_char_ptr *)0x0) {
          (*pEVar5[functionId].funcPtrWrap)
                    (pEVar5[functionId].funcPtrWrapTarget,(char *)paVar14,(char *)paVar14);
          if (this->callContinue != true) {
            return false;
          }
          uVar6 = (this->callStack).count;
          if (uVar6 != 0) {
            (this->callStack).count = uVar6 - 1;
            if (RVar7 == rvrInt) {
              regFilePtr[uVar13].field_0.intValue = paVar14->intValue;
            }
            else if (RVar7 == rvrLong) {
              regFilePtr[uVar13].field_0 = *paVar14;
            }
            else if (RVar7 == rvrDouble) {
              regFilePtr[uVar13].field_0 = *paVar14;
            }
            uVar6 = *puVar11;
            while (uVar6 != 7) {
              if (uVar6 == 10) {
                puVar10 = puVar11 + 1;
                puVar1 = puVar11 + 2;
                uVar6 = puVar11[3];
                puVar11 = puVar11 + 4;
                memcpy((void *)((ulong)*puVar1 + regFilePtr[*puVar10].field_0.longValue),paVar14,
                       (ulong)uVar6);
                paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                          ((long)paVar14 + (ulong)(uVar6 & 0xfffffffc));
              }
              else if (uVar6 == 9) {
                puVar10 = puVar11 + 1;
                puVar11 = puVar11 + 2;
                regFilePtr[*puVar10].field_0 = *paVar14;
                paVar14 = paVar14 + 1;
              }
              else if (uVar6 == 8) {
                puVar10 = puVar11 + 1;
                puVar11 = puVar11 + 2;
                regFilePtr[*puVar10].field_0.intValue = paVar14->intValue;
                paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
              }
              else {
                puVar11 = puVar11 + 1;
              }
              uVar6 = *puVar11;
            }
            return true;
          }
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x73,
                        "void FastVector<RegVmCmd *>::pop_back() [T = RegVmCmd *, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        pcVar9 = "ERROR: external raw function calls are disabled";
      }
      else {
        uVar2 = (this->callStack).count;
        if (uVar2 == (this->callStack).max) {
          FastVector<RegVmCmd_*,_false,_false>::grow_and_add(&this->callStack,uVar2,&local_58);
        }
        else {
          (this->callStack).count = uVar2 + 1;
          (this->callStack).data[uVar2] = local_58;
        }
        uVar2 = (this->dataStack).count;
        local_4c = RVar7;
        local_38 = uVar13;
        if ((uVar2 & 0xf) != 0) {
          __assert_fail("dataStack.size() % 16 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0x5b5,
                        "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                       );
        }
        uVar3 = pEVar5[functionId].argumentSize;
        uVar12 = pEVar5[functionId].stackSize + 0xf & 0xfffffff0;
        if (uVar12 < uVar3) {
          __assert_fail("argumentsSize <= stackSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                        ,0x5b6,
                        "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                       );
        }
        if (uVar2 + uVar12 < (this->dataStack).max) {
          paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                    ((long)paVar14 - (ulong)(uVar3 & 0xfffffffc));
          if (paVar14 != (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase) {
            __assert_fail("tempStackPtr == tempStackArrayBase",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                          ,0x5c2,
                          "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                         );
          }
          memcpy((this->dataStack).data + uVar2,paVar14,(ulong)uVar3);
          local_40 = &this->regFileLastTop->field_0;
          iVar4 = pEVar5[functionId].regVmRegisters;
          this->regFileLastTop = (RegVmRegister *)(local_40 + iVar4);
          if (local_40 + iVar4 < &this->regFileArrayEnd->field_0) {
            this_00 = &this->dataStack;
            newSize = (this->dataStack).count + uVar12;
            if ((this->dataStack).max <= newSize) {
              local_48 = this_00;
              FastVector<char,_true,_true>::grow(this_00,newSize);
              this_00 = local_48;
            }
            (this->dataStack).count = newSize;
            if (uVar12 != uVar3) {
              memset(this_00->data + (ulong)uVar3 + (ulong)uVar2,0,(ulong)(uVar12 - uVar3));
            }
            regFilePtr_00 = local_40;
            *local_40 = (anon_union_8_3_3250f155_for_RegVmRegister_0)(this->dataStack).data;
            local_40[1].longValue = (int64_t)((this->dataStack).data + uVar2);
            local_40[2] = (anon_union_8_3_3250f155_for_RegVmRegister_0)
                          (this->exLinker->exRegVmConstants).data;
            local_40[3].longValue = (int64_t)local_40;
            memset(local_40 + 4,0,(long)this->regFileLastTop + (-0x20 - (long)local_40));
            RVar7 = RunCode(this->codeBase + uVar6,(RegVmRegister *)regFilePtr_00,this,
                            this->codeBase);
            if (RVar7 == rvrError) {
              return RVar7 != rvrError;
            }
            if (RVar7 != local_4c) {
              __assert_fail("execResultType == resultType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_RegVm.cpp"
                            ,0x5e3,
                            "bool ExecutorRegVm::ExecCall(unsigned int, unsigned int, RegVmCmd *const, RegVmRegister *const)"
                           );
            }
            this->regFileLastTop = (RegVmRegister *)regFilePtr_00;
            if (uVar2 <= (this->dataStack).count) {
              (this->dataStack).count = uVar2;
              if (local_4c == rvrInt) {
                regFilePtr[local_38 & 0xffffffff].field_0.intValue = paVar14->intValue;
              }
              else if ((local_4c == rvrLong) || (local_4c == rvrDouble)) {
                regFilePtr[local_38 & 0xffffffff].field_0 = *paVar14;
              }
              uVar6 = *puVar11;
              while (uVar6 != 7) {
                if (uVar6 == 10) {
                  puVar10 = puVar11 + 1;
                  puVar1 = puVar11 + 2;
                  uVar6 = puVar11[3];
                  puVar11 = puVar11 + 4;
                  memcpy((void *)((ulong)*puVar1 + regFilePtr[*puVar10].field_0.longValue),paVar14,
                         (ulong)uVar6);
                  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                            ((long)paVar14 + (ulong)(uVar6 & 0xfffffffc));
                }
                else if (uVar6 == 9) {
                  puVar10 = puVar11 + 1;
                  puVar11 = puVar11 + 2;
                  regFilePtr[*puVar10].field_0 = *paVar14;
                  paVar14 = paVar14 + 1;
                }
                else if (uVar6 == 8) {
                  puVar10 = puVar11 + 1;
                  puVar11 = puVar11 + 2;
                  regFilePtr[*puVar10].field_0.intValue = paVar14->intValue;
                  paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
                }
                else {
                  puVar11 = puVar11 + 1;
                }
                uVar6 = *puVar11;
              }
              return true;
            }
            __assert_fail("newSize <= count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x8e,
                          "void FastVector<char, true, true>::shrink(unsigned int) [T = char, zeroNewMemory = true, skipConstructor = true]"
                         );
          }
          pcVar9 = "ERROR: register overflow";
        }
        else {
          pcVar9 = "ERROR: stack overflow";
        }
      }
      this->codeRunning = false;
      this->callContinue = false;
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",pcVar9);
      this->execErrorMessage = this->execErrorBuffer;
      (this->execErrorObject).typeID = 0;
      (this->execErrorObject).ptr = (char *)0x0;
      return false;
    }
    switch(uVar6) {
    case 2:
      uVar6 = regFilePtr[puVar10[1]].field_0.intValue;
      goto LAB_00142f81;
    case 3:
      aVar8 = regFilePtr[puVar10[1]].field_0;
      goto LAB_00142f9e;
    case 4:
      uVar6 = puVar10[1];
LAB_00142f81:
      puVar10 = puVar10 + 2;
      paVar14->intValue = uVar6;
      paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)((long)paVar14 + 4);
      break;
    case 5:
      aVar8.longValue._4_4_ = 0;
      aVar8.intValue = puVar10[1];
LAB_00142f9e:
      puVar10 = puVar10 + 2;
      *paVar14 = aVar8;
      paVar14 = paVar14 + 1;
      break;
    case 6:
      puVar11 = puVar10 + 1;
      puVar1 = puVar10 + 2;
      uVar6 = puVar10[3];
      puVar10 = puVar10 + 4;
      memcpy(paVar14,(void *)((ulong)*puVar1 + regFilePtr[*puVar11].field_0.longValue),(ulong)uVar6)
      ;
      paVar14 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)
                ((long)paVar14 + (ulong)(uVar6 & 0xfffffffc));
      break;
    default:
      puVar10 = puVar10 + 1;
    }
    uVar6 = *puVar10;
  } while( true );
}

Assistant:

bool ExecutorRegVm::ExecCall(unsigned microcodePos, unsigned functionId, RegVmCmd * const instruction, RegVmRegister * const regFilePtr)
{
	unsigned *tempStackPtr = tempStackArrayBase;

	ExternFuncInfo &target = exFunctions[functionId];

	// Push arguments
	unsigned *microcode = exLinker->exRegVmConstants.data + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			*tempStackPtr = regFilePtr[*microcode++].intValue;
			tempStackPtr += 1;
			break;
		case rvmiPushQword:
			memcpy(tempStackPtr, &regFilePtr[*microcode++].longValue, sizeof(long long));
			tempStackPtr += 2;
			break;
		case rvmiPushImm:
			*tempStackPtr = *microcode++;
			tempStackPtr += 1;
			break;
		case rvmiPushImmq:
			vmStoreLong(tempStackPtr, *microcode++);
			tempStackPtr += 2;
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy(tempStackPtr, (char*)regFilePtr[reg].ptrValue + offset, size);
			tempStackPtr += size >> 2;
		}
		break;
		}
	}

	microcode++;

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

	unsigned address = target.regVmAddress;

	if(address == ~0u)
	{
		callStack.push_back(instruction + 1);

		// Take arguments
		tempStackPtr -= target.argumentSize >> 2;

		assert(tempStackPtr == tempStackArrayBase);

		if(target.funcPtrWrap)
		{
			target.funcPtrWrap(target.funcPtrWrapTarget, (char*)tempStackPtr, (char*)tempStackPtr);

			if(!callContinue)
				return false;
		}
		else
		{
			if(!RunExternalFunction(functionId, tempStackPtr))
				return false;
		}

		callStack.pop_back();

		switch(resultType)
		{
		case rvrDouble:
			memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
			break;
		case rvrLong:
			memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
			break;
		case rvrInt:
			regFilePtr[resultReg].intValue = *tempStackPtr;
			break;
		default:
			break;
		}

		unsigned *curr = tempStackPtr;

		while(*microcode != rvmiReturn)
		{
			switch(*microcode++)
			{
			case rvmiPop:
				regFilePtr[*microcode++].intValue = *curr;
				curr += 1;
				break;
			case rvmiPopq:
				regFilePtr[*microcode++].longValue = vmLoadLong(curr);
				curr += 2;
				break;
			case rvmiPopMem:
			{
				unsigned reg = *microcode++;
				unsigned offset = *microcode++;
				unsigned size = *microcode++;
				memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
				curr += size >> 2;
			}
			break;
			}
		}

		return true;
	}

	callStack.push_back(instruction + 1);

	unsigned prevDataSize = dataStack.size();

	unsigned argumentsSize = target.argumentSize;
	unsigned stackSize = (target.stackSize + 0xf) & ~0xf;

	assert(dataStack.size() % 16 == 0);
	assert(argumentsSize <= stackSize);

	if(dataStack.size() + stackSize >= dataStack.max)
	{
		Stop("ERROR: stack overflow");

		return false;
	}

	// Take arguments
	tempStackPtr -= target.argumentSize >> 2;

	assert(tempStackPtr == tempStackArrayBase);

	// Copy function arguments to new stack frame
	memcpy((char*)(dataStack.data + dataStack.size()), tempStackPtr, argumentsSize);

	RegVmRegister *regFileTop = regFileLastTop;

	regFileLastTop = regFileTop + target.regVmRegisters;

	if(regFileLastTop >= regFileArrayEnd)
	{
		Stop("ERROR: register overflow");

		return false;
	}

	dataStack.resize(dataStack.size() + stackSize);

	if(stackSize - argumentsSize)
		memset(dataStack.data + prevDataSize + argumentsSize, 0, stackSize - argumentsSize);

	regFileTop[rvrrGlobals].ptrValue = uintptr_t(dataStack.data);
	regFileTop[rvrrFrame].ptrValue = uintptr_t(dataStack.data + prevDataSize);
	regFileTop[rvrrConstants].ptrValue = uintptr_t(exLinker->exRegVmConstants.data);
	regFileTop[rvrrRegisters].ptrValue = uintptr_t(regFileTop);

	memset(regFileTop + rvrrCount, 0, (regFileLastTop - regFileTop - rvrrCount) * sizeof(regFilePtr[0]));

	RegVmReturnType execResultType = RunCode(codeBase + address, regFileTop, this, codeBase);

	if(execResultType == rvrError)
		return false;

	assert(execResultType == resultType);

	regFileLastTop = regFileTop;

	dataStack.shrink(prevDataSize);

	switch(resultType)
	{
	case rvrDouble:
		memcpy(&regFilePtr[resultReg].doubleValue, tempStackPtr, sizeof(double));
		break;
	case rvrLong:
		memcpy(&regFilePtr[resultReg].longValue, tempStackPtr, sizeof(long long));
		break;
	case rvrInt:
		regFilePtr[resultReg].intValue = *tempStackPtr;
		break;
	default:
		break;
	}

	unsigned *curr = tempStackPtr;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			regFilePtr[*microcode++].intValue = *curr;
			curr += 1;
			break;
		case rvmiPopq:
			regFilePtr[*microcode++].longValue = vmLoadLong(curr);
			curr += 2;
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;
			memcpy((char*)regFilePtr[reg].ptrValue + offset, curr, size);
			curr += size >> 2;
		}
		break;
		}
	}

	return true;
}